

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_gettc(EditLine *el,wchar_t argc,char **argv)

{
  char *__s2;
  wchar_t *pwVar1;
  int iVar2;
  void *how;
  char *what;
  termcapval *tv;
  termcapstr *ts;
  char **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if (((argv == (char **)0x0) || (argv[1] == (char *)0x0)) || (argv[2] == (char *)0x0)) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    __s2 = argv[1];
    pwVar1 = (wchar_t *)argv[2];
    tv = (termcapval *)tstr;
    while ((tv->name != (char *)0x0 && (iVar2 = strcmp(tv->name,__s2), iVar2 != 0))) {
      tv = tv + 1;
    }
    if (tv->name == (char *)0x0) {
      what = (char *)tval;
      while ((*(long *)what != 0 && (iVar2 = strcmp(*(char **)what,__s2), iVar2 != 0))) {
        what = what + 0x10;
      }
      if (*(long *)what == 0) {
        el_local._4_4_ = L'\xffffffff';
      }
      else if (((((termcapval *)what == tval + 1) || ((termcapval *)what == tval + 4)) ||
               ((termcapval *)what == tval)) || ((termcapval *)what == tval + 6)) {
        if ((el->el_terminal).t_val[(long)(what + -0x141a40) >> 4] == L'\0') {
          *(char **)pwVar1 = terminal_gettc::no;
        }
        else {
          *(char **)pwVar1 = terminal_gettc::yes;
        }
        el_local._4_4_ = L'\0';
      }
      else {
        *pwVar1 = (el->el_terminal).t_val[(long)(what + -0x141a40) >> 4];
        el_local._4_4_ = L'\0';
      }
    }
    else {
      *(char **)pwVar1 = (el->el_terminal).t_str[(long)(tv + -0x1417c) >> 4];
      el_local._4_4_ = L'\0';
    }
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_gettc(EditLine *el, int argc __attribute__((__unused__)), char **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char *what;
	void *how;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	what = argv[1];
	how = argv[2];

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		*(char **)how = el->el_terminal.t_str[ts - tstr];
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL)
		return -1;

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		static char yes[] = "yes";
		static char no[] = "no";
		if (el->el_terminal.t_val[tv - tval])
			*(char **)how = yes;
		else
			*(char **)how = no;
		return 0;
	} else {
		*(int *)how = el->el_terminal.t_val[tv - tval];
		return 0;
	}
}